

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

void htmlAutoClose(htmlParserCtxtPtr ctxt,xmlChar *newtag)

{
  endElementSAXFunc p_Var1;
  int iVar2;
  
  if ((newtag != (xmlChar *)0x0) && ((ctxt->options & 2U) == 0)) {
    while ((ctxt->name != (xmlChar *)0x0 &&
           (iVar2 = htmlCheckAutoClose(newtag,ctxt->name), iVar2 != 0))) {
      htmlParserFinishElementParsing(ctxt);
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (p_Var1 = ctxt->sax->endElement, p_Var1 != (endElementSAXFunc)0x0)) {
        (*p_Var1)(ctxt->userData,ctxt->name);
      }
      htmlnamePop(ctxt);
    }
  }
  return;
}

Assistant:

static void
htmlAutoClose(htmlParserCtxtPtr ctxt, const xmlChar * newtag)
{
    if (ctxt->options & HTML_PARSE_HTML5)
        return;

    if (newtag == NULL)
        return;

    while ((ctxt->name != NULL) &&
           (htmlCheckAutoClose(newtag, ctxt->name))) {
	htmlParserFinishElementParsing(ctxt);
        if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL))
            ctxt->sax->endElement(ctxt->userData, ctxt->name);
	htmlnamePop(ctxt);
    }
}